

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_fill.c
# Opt level: O0

MPP_RET fill_slice_syntax(H264_SLICE_t *currSlice,H264dDxvaCtx_t *dxva_ctx)

{
  uint uVar1;
  _DXVA_Slice_H264_Long *p_Var2;
  RK_S32 bottom_flag;
  RK_S32 dpb_valid;
  RK_S32 dpb_idx;
  DXVA_Slice_H264_Long *p_long;
  uint local_28;
  MPP_RET ret;
  RK_U32 i;
  RK_U32 list;
  H264dDxvaCtx_t *dxva_ctx_local;
  H264_SLICE_t *currSlice_local;
  
  currSlice_local._4_4_ = fill_slice_stream(dxva_ctx,&currSlice->p_Cur->nalu);
  if (currSlice_local._4_4_ < MPP_OK) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_fill","Function error(%d).\n",(char *)0x0,0x12d);
    }
  }
  else {
    p_Var2 = dxva_ctx->slice_long;
    uVar1 = dxva_ctx->slice_count;
    p_Var2[uVar1].first_mb_in_slice = (RK_U16)currSlice->start_mb_nr;
    p_Var2[uVar1].NumMbsForSlice = 0;
    p_Var2[uVar1].slice_type = (RK_U8)currSlice->slice_type;
    p_Var2[uVar1].num_ref_idx_l0_active_minus1 =
         (RK_U8)currSlice->active_pps->num_ref_idx_l0_default_active_minus1;
    p_Var2[uVar1].num_ref_idx_l1_active_minus1 =
         (RK_U8)currSlice->active_pps->num_ref_idx_l1_default_active_minus1;
    p_Var2[uVar1].redundant_pic_cnt = (RK_U8)currSlice->redundant_pic_cnt;
    p_Var2[uVar1].direct_spatial_mv_pred_flag = (RK_U8)currSlice->direct_spatial_mv_pred_flag;
    p_Var2[uVar1].slice_id = (RK_U16)dxva_ctx->slice_count;
    p_Var2[uVar1].active_sps_id = currSlice->active_sps->seq_parameter_set_id;
    p_Var2[uVar1].active_pps_id = currSlice->active_pps->pic_parameter_set_id;
    p_Var2[uVar1].idr_pic_id = currSlice->idr_pic_id;
    p_Var2[uVar1].idr_flag = currSlice->idr_flag;
    p_Var2[uVar1].drpm_used_bitlen = currSlice->drpm_used_bitlen;
    p_Var2[uVar1].poc_used_bitlen = currSlice->poc_used_bitlen;
    p_Var2[uVar1].nal_ref_idc = currSlice->nal_reference_idc;
    p_Var2[uVar1].profileIdc = currSlice->active_sps->profile_idc;
    for (local_28 = 0; local_28 < 0x20; local_28 = local_28 + 1) {
      if (currSlice->p_Dec->refpic_info_p[local_28].valid == 0) {
        p_Var2[uVar1].RefPicList[0][local_28].field_0 =
             (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0)0xff;
      }
      else {
        fill_picture_entry(p_Var2[uVar1].RefPicList[0] + local_28,
                           currSlice->p_Dec->refpic_info_p[local_28].dpb_idx,
                           currSlice->p_Dec->refpic_info_p[local_28].bottom_flag);
      }
    }
    for (ret = MPP_OK; (uint)ret < 2; ret = ret + ~MPP_ERR_UNKNOW) {
      for (local_28 = 0; local_28 < 0x20; local_28 = local_28 + 1) {
        if (currSlice->p_Dec->refpic_info_b[(uint)ret][local_28].valid == 0) {
          p_Var2[uVar1].RefPicList[(uint)(ret + ~MPP_ERR_UNKNOW)][local_28].field_0 =
               (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_H264_0)0xff;
        }
        else {
          fill_picture_entry(p_Var2[uVar1].RefPicList[(uint)(ret + ~MPP_ERR_UNKNOW)] + local_28,
                             currSlice->p_Dec->refpic_info_b[(uint)ret][local_28].dpb_idx,
                             currSlice->p_Dec->refpic_info_b[(uint)ret][local_28].bottom_flag);
        }
      }
    }
    dxva_ctx->slice_count = dxva_ctx->slice_count + 1;
    currSlice_local._4_4_ = MPP_OK;
  }
  return currSlice_local._4_4_;
}

Assistant:

MPP_RET fill_slice_syntax(H264_SLICE_t *currSlice, H264dDxvaCtx_t *dxva_ctx)
{
    RK_U32 list = 0, i = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    DXVA_Slice_H264_Long *p_long  = NULL;
    RK_S32 dpb_idx = 0, dpb_valid = 0, bottom_flag = 0;

    FUN_CHECK(ret = fill_slice_stream(dxva_ctx, &currSlice->p_Cur->nalu));
    p_long  = &dxva_ctx->slice_long[dxva_ctx->slice_count];
    //!< fill slice long contents
    p_long->first_mb_in_slice = currSlice->start_mb_nr;
    p_long->NumMbsForSlice = 0;       //!< XXX it is set once we have all slices
    p_long->slice_type = currSlice->slice_type;
    p_long->num_ref_idx_l0_active_minus1 = currSlice->active_pps->num_ref_idx_l0_default_active_minus1;
    p_long->num_ref_idx_l1_active_minus1 = currSlice->active_pps->num_ref_idx_l1_default_active_minus1;
    p_long->redundant_pic_cnt = currSlice->redundant_pic_cnt;
    p_long->direct_spatial_mv_pred_flag = currSlice->direct_spatial_mv_pred_flag;
    p_long->slice_id = dxva_ctx->slice_count;
    //!< add parameters
    p_long->active_sps_id = currSlice->active_sps->seq_parameter_set_id;
    p_long->active_pps_id = currSlice->active_pps->pic_parameter_set_id;
    p_long->idr_pic_id = currSlice->idr_pic_id;
    p_long->idr_flag = currSlice->idr_flag;
    p_long->drpm_used_bitlen = currSlice->drpm_used_bitlen;
    p_long->poc_used_bitlen = currSlice->poc_used_bitlen;
    p_long->nal_ref_idc = currSlice->nal_reference_idc;
    p_long->profileIdc = currSlice->active_sps->profile_idc;

    for (i = 0; i < MPP_ARRAY_ELEMS(p_long->RefPicList[0]); i++) {
        dpb_idx = currSlice->p_Dec->refpic_info_p[i].dpb_idx;
        dpb_valid = currSlice->p_Dec->refpic_info_p[i].valid;
        //dpb_valid = (currSlice->p_Dec->dpb_info[dpb_idx].refpic ? 1 : 0);
        if (dpb_valid) {
            bottom_flag = currSlice->p_Dec->refpic_info_p[i].bottom_flag;
            fill_picture_entry(&p_long->RefPicList[0][i], dpb_idx, bottom_flag);
        } else {
            p_long->RefPicList[0][i].bPicEntry = 0xff;
        }
    }

    for (list = 0; list < 2; list++) {
        for (i = 0; i < MPP_ARRAY_ELEMS(p_long->RefPicList[list + 1]); i++) {
            dpb_idx = currSlice->p_Dec->refpic_info_b[list][i].dpb_idx;
            dpb_valid = currSlice->p_Dec->refpic_info_b[list][i].valid;
            //dpb_valid = (currSlice->p_Dec->dpb_info[dpb_idx].refpic ? 1 : 0);
            if (dpb_valid) {
                bottom_flag = currSlice->p_Dec->refpic_info_b[list][i].bottom_flag;
                fill_picture_entry(&p_long->RefPicList[list + 1][i], dpb_idx, bottom_flag);
            } else {
                p_long->RefPicList[list + 1][i].bPicEntry = 0xff;
            }
        }
    }
    dxva_ctx->slice_count++;

    return ret = MPP_OK;
__FAILED:
    return ret;
}